

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cComputeShaderTests.cpp
# Opt level: O3

long __thiscall glcts::anon_unknown_0::AdvancedSharedIndexing::Run(AdvancedSharedIndexing *this)

{
  CallLogWrapper *this_00;
  GLuint *textures;
  byte bVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  bool bVar4;
  GLuint program;
  GLint GVar5;
  int iVar6;
  long lVar7;
  void *__s;
  float *__s_00;
  undefined8 *pixels;
  float *pfVar8;
  uint uVar9;
  bool *compile_error;
  value_type_conflict1 *__val;
  ulong uVar10;
  value_type_conflict5 *__val_1;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  GLfloat values [16];
  
  values._0_8_ = values + 4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)values,
             "\nlayout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;\nlayout (local_size_x = 4,local_size_y=4 ) in;\nshared vec4 g_shared1[4];\nshared mat4 g_shared2;\nshared struct {\n  float data[4];\n} g_shared3[4];\nshared struct Type { float data[4]; } g_shared4[4];\nshared Type g_shared5[4];\nuniform bool g_true;\nuniform float g_values[16];\n\nvoid Sync() {\n  groupMemoryBarrier();\n  barrier();\n}\nvoid SetMemory(ivec2 xy, float value) {\n  g_shared1[xy.y][gl_LocalInvocationID.x] = value;\n  g_shared2[xy.y][xy.x] = value;\n  g_shared3[xy[1]].data[xy[0]] = value;\n  g_shared4[xy.y].data[xy[0]] = value;\n  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;\n}\nbool CheckMemory(ivec2 xy, float expected) {\n  if (g_shared1[xy.y][xy[0]] != expected) return false;\n  if (g_shared2[xy[1]][xy[0]] != expected) return false;\n  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;\n  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;\n  if (g_shared5[xy.y].data[xy.x] != expected) return false;\n  return true;\n}\nvoid main() {\n  ivec2 thread_xy = ivec2(gl_LocalInvocationID);\n  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);\n  Sync();\n  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n\n  if (g_true && gl_LocalInvocationID.x < 10u) {\n    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);\n    Sync();\n    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, 1.0);\n  }\n\n  imageStore(g_result_image, thread_xy, result);\n}"
             ,"");
  program = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,(string *)values)
  ;
  this->m_program = program;
  if ((GLfloat *)values._0_8_ != values + 4) {
    operator_delete((void *)values._0_8_,values._16_8_ + 1);
    program = this->m_program;
  }
  this_00 = &(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glLinkProgram(this_00,program);
  bVar4 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,compile_error);
  lVar7 = -1;
  if (bVar4) {
    __s = operator_new(0x100);
    textures = &this->m_texture;
    memset(__s,0,0x100);
    glu::CallLogWrapper::glGenTextures(this_00,1,textures);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2601);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,0x8058,4,4);
    glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,4,4,0x1908,0x1401,__s);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
    operator_delete(__s,0x100);
    glu::CallLogWrapper::glBindImageTexture(this_00,3,this->m_texture,0,'\0',0,0x88b9,0x8058);
    glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_true");
    glu::CallLogWrapper::glUniform1i(this_00,GVar5,1);
    values[0xc] = 13.0;
    values[0xd] = 14.0;
    values[0xe] = 15.0;
    values[0xf] = 16.0;
    values[8] = 9.0;
    values[9] = 10.0;
    values[10] = 11.0;
    values[0xb] = 12.0;
    values[4] = 5.0;
    values[5] = 6.0;
    values[6] = 7.0;
    values[7] = 8.0;
    values[0] = 1.0;
    values[1] = 2.0;
    values[2] = 3.0;
    values[3] = 4.0;
    GVar5 = glu::CallLogWrapper::glGetUniformLocation(this_00,this->m_program,"g_values");
    glu::CallLogWrapper::glUniform1fv(this_00,GVar5,0x10,values);
    glu::CallLogWrapper::glDispatchCompute(this_00,1,1,1);
    __s_00 = (float *)operator_new(0x100);
    memset(__s_00,0,0x100);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,*textures);
    glu::CallLogWrapper::glMemoryBarrier(this_00,0x100);
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&this->m_fbo);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,this->m_fbo);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,0x8ce0,0xde1,*textures,0);
    pixels = (undefined8 *)operator_new(0x40);
    pixels[6] = 0;
    pixels[7] = 0;
    pixels[4] = 0;
    pixels[5] = 0;
    pixels[2] = 0;
    pixels[3] = 0;
    *pixels = 0;
    pixels[1] = 0;
    glu::CallLogWrapper::glReadPixels(this_00,0,0,4,4,0x1908,0x1401,pixels);
    auVar2 = _DAT_01a35670;
    lVar7 = 0;
    do {
      auVar11._0_8_ = (double)*(byte *)((long)pixels + lVar7);
      auVar11._8_8_ = (double)*(byte *)((long)pixels + lVar7 + 4);
      auVar11 = divpd(auVar11,auVar2);
      auVar13._0_8_ = (double)*(byte *)((long)pixels + lVar7 + 1);
      auVar13._8_8_ = (double)*(byte *)((long)pixels + lVar7 + 5);
      auVar13 = divpd(auVar13,auVar2);
      auVar14._0_8_ = (double)*(byte *)((long)pixels + lVar7 + 2);
      auVar14._8_8_ = (double)*(byte *)((long)pixels + lVar7 + 6);
      auVar14 = divpd(auVar14,auVar2);
      bVar1 = *(byte *)((long)pixels + lVar7 + 3);
      uVar9 = (uint)bVar1;
      auVar15._0_8_ = (double)bVar1;
      auVar15._8_8_ = (double)*(byte *)((long)pixels + lVar7 + 7);
      auVar15 = divpd(auVar15,auVar2);
      pfVar8 = __s_00 + lVar7 + 4;
      *pfVar8 = (float)auVar11._8_8_;
      pfVar8[1] = (float)auVar13._8_8_;
      pfVar8[2] = (float)auVar14._8_8_;
      pfVar8[3] = (float)auVar15._8_8_;
      pfVar8 = __s_00 + lVar7;
      *pfVar8 = (float)auVar11._0_8_;
      pfVar8[1] = (float)auVar13._0_8_;
      pfVar8[2] = (float)auVar14._0_8_;
      pfVar8[3] = (float)auVar15._0_8_;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x40);
    auVar2._4_4_ = -(uint)(__s_00[1] != 1.0);
    auVar2._0_4_ = -(uint)(*__s_00 != 0.0);
    auVar2._8_4_ = -(uint)(__s_00[2] != 0.0);
    auVar2._12_4_ = -(uint)(__s_00[3] != 1.0);
    iVar6 = movmskps(0x40,auVar2);
    if (iVar6 == 0) {
      uVar3 = 0xffffffffffffffff;
      pfVar8 = __s_00;
      do {
        uVar10 = uVar3;
        if (uVar10 == 0xe) {
          bVar4 = false;
          goto LAB_00c1fed9;
        }
        auVar12._4_4_ = -(uint)(pfVar8[5] != 1.0);
        auVar12._0_4_ = -(uint)(pfVar8[4] != 0.0);
        auVar12._8_4_ = -(uint)(pfVar8[6] != 0.0);
        auVar12._12_4_ = -(uint)(pfVar8[7] != 1.0);
        uVar9 = movmskps(uVar9,auVar12);
        uVar3 = uVar10 + 1;
        pfVar8 = pfVar8 + 4;
      } while (uVar9 == 0);
      bVar4 = uVar10 + 1 < 0xf;
      lVar7 = uVar10 + 2;
    }
    else {
      bVar4 = true;
      lVar7 = 0;
    }
    anon_unknown_0::Output("Invalid data at index %d.\n",lVar7);
LAB_00c1fed9:
    operator_delete(pixels,0x40);
    operator_delete(__s_00,0x100);
    lVar7 = -(ulong)bVar4;
  }
  return lVar7;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(binding = 3, rgba8) uniform mediump writeonly image2D g_result_image;" NL
			   "layout (local_size_x = 4,local_size_y=4 ) in;" NL "shared vec4 g_shared1[4];" NL
			   "shared mat4 g_shared2;" NL "shared struct {" NL "  float data[4];" NL "} g_shared3[4];" NL
			   "shared struct Type { float data[4]; } g_shared4[4];" NL "shared Type g_shared5[4];" NL
			   "uniform bool g_true;" NL "uniform float g_values[16];" NL NL "void Sync() {" NL
			   "  groupMemoryBarrier();" NL "  barrier();" NL "}" NL "void SetMemory(ivec2 xy, float value) {" NL
			   "  g_shared1[xy.y][gl_LocalInvocationID.x] = value;" NL "  g_shared2[xy.y][xy.x] = value;" NL
			   "  g_shared3[xy[1]].data[xy[0]] = value;" NL "  g_shared4[xy.y].data[xy[0]] = value;" NL
			   "  g_shared5[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] = value;" NL "}" NL
			   "bool CheckMemory(ivec2 xy, float expected) {" NL
			   "  if (g_shared1[xy.y][xy[0]] != expected) return false;" NL
			   "  if (g_shared2[xy[1]][xy[0]] != expected) return false;" NL
			   "  if (g_shared3[gl_LocalInvocationID.y].data[gl_LocalInvocationID.x] != expected) return false;" NL
			   "  if (g_shared4[gl_LocalInvocationID.y].data[xy.x] != expected) return false;" NL
			   "  if (g_shared5[xy.y].data[xy.x] != expected) return false;" NL "  return true;" NL "}" NL
			   "void main() {" NL "  ivec2 thread_xy = ivec2(gl_LocalInvocationID);" NL
			   "  vec4 result = vec4(0.0, 1.0, 0.0, 1.0);" NL NL
			   "  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0);" NL "  Sync();" NL
			   "  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 1.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL NL "  SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0);" NL "  Sync();" NL
			   "  if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * -1.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL NL "  if (g_true && gl_LocalInvocationID.x < 10u) {" NL
			   "    SetMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0);" NL "    Sync();" NL
			   "    if (!CheckMemory(thread_xy, g_values[gl_LocalInvocationIndex] * 7.0)) result = vec4(1.0, 0.0, 0.0, "
			   "1.0);" NL "  }" NL NL "  imageStore(g_result_image, thread_xy, result);" NL "}";

		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		/* init texture */
		{
			std::vector<GLint> data(4 * 4 * 4);
			glGenTextures(1, &m_texture);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			glTexStorage2D(GL_TEXTURE_2D, 1, GL_RGBA8, 4, 4);
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &data[0]);
			glBindTexture(GL_TEXTURE_2D, 0);
		}

		glBindImageTexture(3, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA8);
		glUseProgram(m_program);
		glUniform1i(glGetUniformLocation(m_program, "g_true"), GL_TRUE);
		GLfloat values[16] = { 1.f, 2.f, 3.f, 4.f, 5.f, 6.f, 7.f, 8.f, 9.f, 10.f, 11.f, 12.f, 13.f, 14.f, 15.f, 16.f };
		glUniform1fv(glGetUniformLocation(m_program, "g_values"), 16, values);
		glDispatchCompute(1, 1, 1);

		/* validate render target */
		{
			std::vector<vec4> data(4 * 4);
			glBindTexture(GL_TEXTURE_2D, m_texture);
			glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
			glGenFramebuffers(1, &m_fbo);
			glBindFramebuffer(GL_FRAMEBUFFER, m_fbo);
			glFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_texture, 0);
			std::vector<GLubyte> colorData(4 * 4 * 4);
			glReadPixels(0, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, &colorData[0]);
			for (int i = 0; i < 4 * 4 * 4; i += 4)
			{
				data[i / 4] =
					vec4(static_cast<GLfloat>(colorData[i] / 255.), static_cast<GLfloat>(colorData[i + 1] / 255.),
						 static_cast<GLfloat>(colorData[i + 2] / 255.), static_cast<GLfloat>(colorData[i + 3] / 255.));
			}
			for (std::size_t i = 0; i < data.size(); ++i)
			{
				if (!IsEqual(data[i], vec4(0, 1, 0, 1)))
				{
					Output("Invalid data at index %d.\n", i);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}